

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O2

string * __thiscall
Assimp::ObjExporter::GetMaterialName_abi_cxx11_
          (string *__return_storage_ptr__,ObjExporter *this,uint index)

{
  aiMaterial *pMat;
  aiReturn aVar1;
  int iVar2;
  allocator<char> local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  char number [13];
  aiString s;
  
  pMat = this->pScene->mMaterials[index];
  if (pMat == (aiMaterial *)0x0) {
    if (GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_);
      if (iVar2 != 0) {
        GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_.field_2;
        GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_._M_string_length = 0;
        GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_.field_2._M_local_buf[0] = '\0'
        ;
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_);
      }
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_);
  }
  else {
    s.length = 0;
    s.data[0] = '\0';
    memset(s.data + 1,0x1b,0x3ff);
    aVar1 = aiGetMaterialString(pMat,"?mat.name",0,0,&s);
    if (aVar1 == aiReturn_SUCCESS) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,s.data,s.data + s.length);
    }
    else {
      ASSIMP_itoa10<13ul>(&number,index);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,number,&local_459);
      std::operator+(__return_storage_ptr__,"$Material_",&local_458);
      std::__cxx11::string::~string((string *)&local_458);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ObjExporter::GetMaterialName(unsigned int index) {
    const aiMaterial* const mat = pScene->mMaterials[index];
    if ( nullptr == mat ) {
        static const std::string EmptyStr;
        return EmptyStr;
    }

    aiString s;
    if(AI_SUCCESS == mat->Get(AI_MATKEY_NAME,s)) {
        return std::string(s.data,s.length);
    }

    char number[ sizeof(unsigned int) * 3 + 1 ];
    ASSIMP_itoa10(number,index);
    return "$Material_" + std::string(number);
}